

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramSetRemoveHistogram(VP8LHistogramSet *set,int i,int *num_used)

{
  uint uVar1;
  
  set->histograms[i] = (VP8LHistogram *)0x0;
  *num_used = *num_used + -1;
  uVar1 = set->size;
  if (uVar1 - 1 == i) {
    while ((0 < (int)uVar1 && (set->histograms[(ulong)uVar1 - 1] == (VP8LHistogram *)0x0))) {
      uVar1 = uVar1 - 1;
      set->size = uVar1;
    }
  }
  return;
}

Assistant:

static void HistogramSetRemoveHistogram(VP8LHistogramSet* const set, int i,
                                        int* const num_used) {
  assert(set->histograms[i] != NULL);
  set->histograms[i] = NULL;
  --*num_used;
  // If we remove the last valid one, shrink until the next valid one.
  if (i == set->size - 1) {
    while (set->size >= 1 && set->histograms[set->size - 1] == NULL) {
      --set->size;
    }
  }
}